

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

int strarray_prepend(strarray *array,char *string)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  char *__src;
  
  sVar3 = strlen(string);
  sVar1 = array->length;
  __src = (char *)realloc(array->value,sVar3 + sVar1 + 0x40 & 0xffffffffffffffc0);
  if (__src == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    memmove(__src + sVar3 + 1,__src,array->length);
    memcpy(__src,string,sVar3 + 1);
    array->value = __src;
    array->length = sVar1 + sVar3 + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
strarray_prepend(struct strarray *array, const char *string) {
  size_t length, new_length;
  char *ptr;

  length = strlen(string) + 1;

  new_length = array->length + length;
  ptr = realloc(array->value, STRARRAY_MEMSIZE(new_length));
  if (ptr == NULL) {
    return -1;
  }

  memmove(ptr + length, ptr, array->length);
  memcpy(ptr, string, length);
  array->value = ptr;
  array->length = new_length;
  return 0;
}